

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall cpptempl::TemplateException::~TemplateException(TemplateException *this)

{
  TemplateException *in_RDI;
  
  ~TemplateException(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

TemplateException(std::string reason) : m_reason(std::move(reason)){}